

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  CURLcode CVar1;
  size_t sVar2;
  char *pcVar3;
  dynbuf dyn;
  char buffer [4096];
  dynbuf dStack_1048;
  undefined1 local_1028 [4096];
  
  if (file == (FILE *)0x0) {
    *size = 0;
    *bufp = (char *)0x0;
  }
  else {
    curlx_dyn_init(&dStack_1048,0x40000000);
    sVar2 = fread(local_1028,1,0x1000,(FILE *)file);
    if (sVar2 != 0) {
      do {
        CVar1 = curlx_dyn_addn(&dStack_1048,local_1028,sVar2);
        if (CVar1 != CURLE_OK) {
          return PARAM_NO_MEM;
        }
        sVar2 = fread(local_1028,1,0x1000,(FILE *)file);
      } while (sVar2 != 0);
    }
    sVar2 = curlx_dyn_len(&dStack_1048);
    *size = sVar2;
    pcVar3 = curlx_dyn_ptr(&dStack_1048);
    *bufp = pcVar3;
  }
  return PARAM_OK;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  if(file) {
    size_t nread;
    struct curlx_dynbuf dyn;
    curlx_dyn_init(&dyn, MAX_FILE2MEMORY);
    do {
      char buffer[4096];
      nread = fread(buffer, 1, sizeof(buffer), file);
      if(nread)
        if(curlx_dyn_addn(&dyn, buffer, nread))
          return PARAM_NO_MEM;
    } while(nread);
    *size = curlx_dyn_len(&dyn);
    *bufp = curlx_dyn_ptr(&dyn);
  }
  else {
    *size = 0;
    *bufp = NULL;
  }
  return PARAM_OK;
}